

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStructGet(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  value_type *pvVar2;
  type *ptVar3;
  type *ptVar4;
  Expression *ref_00;
  vector<wasm::Field,_std::allocator<wasm::Field>_> *this_00;
  const_reference field;
  StructGet *pSVar5;
  bool signed_;
  Expression *ref;
  type *fieldIndex;
  type *structType;
  undefined8 local_28;
  vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  *local_20;
  mapped_type *structFields;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  structFields = (mapped_type *)this;
  this_local = (TranslateToFuzzReader *)type.id;
  local_20 = std::
             unordered_map<wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>_>_>
             ::operator[](&this->typeStructFields,(key_type *)&this_local);
  bVar1 = std::
          vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
          ::empty(local_20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!structFields.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1360,"Expression *wasm::TranslateToFuzzReader::makeStructGet(Type)");
  }
  pvVar2 = pick<std::vector<std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
                     (this,local_20);
  structType = (type *)(pvVar2->first).id;
  local_28._0_4_ = pvVar2->second;
  local_28._4_4_ = *(undefined4 *)&pvVar2->field_0xc;
  ptVar3 = std::get<0ul,wasm::HeapType,unsigned_int>
                     ((pair<wasm::HeapType,_unsigned_int> *)&structType);
  ptVar4 = std::get<1ul,wasm::HeapType,unsigned_int>
                     ((pair<wasm::HeapType,_unsigned_int> *)&structType);
  ref_00 = makeTrappingRefUse(this,(HeapType)ptVar3->id);
  this_00 = (vector<wasm::Field,_std::allocator<wasm::Field>_> *)wasm::HeapType::getStruct();
  field = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[](this_00,(ulong)*ptVar4)
  ;
  bVar1 = maybeSignedGet(this,field);
  pSVar5 = Builder::makeStructGet(&this->builder,*ptVar4,ref_00,Unordered,(Type)this_local,bVar1);
  return (Expression *)pSVar5;
}

Assistant:

Expression* TranslateToFuzzReader::makeStructGet(Type type) {
  auto& structFields = typeStructFields[type];
  assert(!structFields.empty());
  auto [structType, fieldIndex] = pick(structFields);
  auto* ref = makeTrappingRefUse(structType);
  auto signed_ = maybeSignedGet(structType.getStruct().fields[fieldIndex]);
  return builder.makeStructGet(
    fieldIndex, ref, MemoryOrder::Unordered, type, signed_);
}